

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O2

void print_result(int f,float res,float param_3,v_array<char> tag)

{
  ulong uVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  float fVar5;
  void *local_1e8;
  ulong local_1e0;
  char temp [30];
  stringstream ss;
  ostream local_190;
  
  if (-1 < f) {
    fVar5 = floorf(res);
    pcVar4 = "%.0f";
    if (fVar5 != res) {
      pcVar4 = "%f";
    }
    if (NAN(fVar5) || NAN(res)) {
      pcVar4 = "%f";
    }
    sprintf(temp,pcVar4,SUB84((double)res,0));
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::operator<<(&local_190,temp);
    print_tag(&ss,tag);
    std::operator<<(&local_190,'\n');
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::stringbuf::str();
    uVar1 = io_buf::write_file_or_socket(f,local_1e8,local_1e0 & 0xffffffff);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (uVar1 != local_1e0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void print_result(int f, float res, float, v_array<char> tag)
{
  if (f >= 0)
  {
    char temp[30];
    if (floorf(res) != res)
      sprintf(temp, "%f", res);
    else
      sprintf(temp, "%.0f", res);
    std::stringstream ss;
    ss << temp;
    print_tag(ss, tag);
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
    {
      cerr << "write error: " << strerror(errno) << endl;
    }
  }
}